

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall
cmCursesMainForm::Render(cmCursesMainForm *this,int left,int top,int width,int height)

{
  bool bVar1;
  CacheEntryType CVar2;
  FIELD *field;
  cmCursesStringWidget *this_00;
  size_type sVar3;
  cmState *pcVar4;
  reference ppcVar5;
  char *pcVar6;
  FORM *pFVar7;
  int iVar8;
  int iVar9;
  int local_224;
  bool local_212;
  int page;
  int row;
  allocator local_149;
  string local_148;
  undefined1 local_122;
  allocator local_121;
  undefined1 local_120 [6];
  bool advanced_1;
  char *local_100;
  char *existingValue_1;
  cmCursesCacheEntryComposite **local_f0;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_e8;
  iterator it_1;
  int i;
  bool isNewPage;
  allocator local_b1;
  string local_b0;
  undefined1 local_8d;
  bool advanced;
  allocator local_79;
  string local_78;
  char *local_58;
  char *existingValue;
  cmCursesCacheEntryComposite **local_48;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_40;
  iterator it;
  cmCursesStringWidget *sw;
  cmCursesWidget *cw;
  FIELD *currentField;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  cmCursesMainForm *this_local;
  
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    field = current_field((this->super_cmCursesForm).Form);
    this_00 = (cmCursesStringWidget *)field_userptr(field);
    CVar2 = cmCursesWidget::GetType((cmCursesWidget *)this_00);
    if (((CVar2 == STRING) ||
        (CVar2 = cmCursesWidget::GetType((cmCursesWidget *)this_00), CVar2 == PATH)) ||
       (CVar2 = cmCursesWidget::GetType((cmCursesWidget *)this_00), CVar2 == FILEPATH)) {
      it._M_current = (cmCursesCacheEntryComposite **)this_00;
      cmCursesStringWidget::SetInEdit(this_00,false);
    }
    unpost_form((this->super_cmCursesForm).Form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (((0x40 < width) && (this->InitialWidth <= width)) && (5 < height)) {
    iVar8 = height + -7;
    if ((this->AdvancedMode & 1U) == 0) {
      this->NumberOfVisibleEntries = 0;
      __gnu_cxx::
      __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
      ::__normal_iterator(&local_40);
      local_48 = (cmCursesCacheEntryComposite **)
                 std::
                 vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 ::begin(this->Entries);
      local_40._M_current = local_48;
      while( true ) {
        existingValue =
             (char *)std::
                     vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                     ::end(this->Entries);
        bVar1 = __gnu_cxx::operator!=
                          (&local_40,
                           (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                            *)&existingValue);
        if (!bVar1) break;
        pcVar4 = cmake::GetState(this->CMakeInstance);
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                  ::operator*(&local_40);
        pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_78,pcVar6,&local_79);
        pcVar6 = cmState::GetCacheEntryValue(pcVar4,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        local_58 = pcVar6;
        pcVar4 = cmake::GetState(this->CMakeInstance);
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                  ::operator*(&local_40);
        pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b0,pcVar6,&local_b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&i,"ADVANCED",(allocator *)((long)&it_1._M_current + 7));
        bVar1 = cmState::GetCacheEntryPropertyAsBool(pcVar4,&local_b0,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_current + 7));
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        if ((local_58 != (char *)0x0) && (((this->AdvancedMode & 1U) != 0 || (!bVar1)))) {
          this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
        }
        local_8d = bVar1;
        __gnu_cxx::
        __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
        ::operator++(&local_40);
      }
    }
    else {
      sVar3 = std::
              vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              ::size(this->Entries);
      this->NumberOfVisibleEntries = sVar3;
    }
    this->NumberOfPages = 1;
    if (0 < iVar8) {
      it_1._M_current._0_4_ = 0;
      __gnu_cxx::
      __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
      ::__normal_iterator(&local_e8);
      local_f0 = (cmCursesCacheEntryComposite **)
                 std::
                 vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 ::begin(this->Entries);
      local_e8._M_current = local_f0;
      while( true ) {
        existingValue_1 =
             (char *)std::
                     vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                     ::end(this->Entries);
        bVar1 = __gnu_cxx::operator!=
                          (&local_e8,
                           (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                            *)&existingValue_1);
        if (!bVar1) break;
        pcVar4 = cmake::GetState(this->CMakeInstance);
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                  ::operator*(&local_e8);
        pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_120,pcVar6,&local_121);
        pcVar6 = cmState::GetCacheEntryValue(pcVar4,(string *)local_120);
        std::__cxx11::string::~string((string *)local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        local_100 = pcVar6;
        pcVar4 = cmake::GetState(this->CMakeInstance);
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                  ::operator*(&local_e8);
        pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_148,pcVar6,&local_149);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&row,"ADVANCED",(allocator *)((long)&page + 3));
        bVar1 = cmState::GetCacheEntryPropertyAsBool(pcVar4,&local_148,(string *)&row);
        std::__cxx11::string::~string((string *)&row);
        std::allocator<char>::~allocator((allocator<char> *)((long)&page + 3));
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        local_122 = bVar1;
        if ((local_100 != (char *)0x0) && (((this->AdvancedMode & 1U) != 0 || (!bVar1)))) {
          iVar9 = (int)it_1._M_current % iVar8 + 1;
          bVar1 = 1 < (int)it_1._M_current / iVar8 + 1;
          local_212 = bVar1 && iVar9 == 1;
          it_1._M_current._6_1_ = local_212;
          if (bVar1 && iVar9 == 1) {
            this->NumberOfPages = this->NumberOfPages + 1;
          }
          ppcVar5 = __gnu_cxx::
                    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                    ::operator*(&local_e8);
          (*((*ppcVar5)->Label->super_cmCursesWidget)._vptr_cmCursesWidget[3])
                    ((*ppcVar5)->Label,(ulong)(uint)left,(ulong)((top + iVar9) - 1),
                     (ulong)(it_1._M_current._6_1_ & 1));
          ppcVar5 = __gnu_cxx::
                    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                    ::operator*(&local_e8);
          (*((*ppcVar5)->IsNewLabel->super_cmCursesWidget)._vptr_cmCursesWidget[3])
                    ((*ppcVar5)->IsNewLabel,(ulong)(left + 0x20),(ulong)((top + iVar9) - 1),0);
          ppcVar5 = __gnu_cxx::
                    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                    ::operator*(&local_e8);
          (*(*ppcVar5)->Entry->_vptr_cmCursesWidget[3])
                    ((*ppcVar5)->Entry,(ulong)(left + 0x21),(ulong)((top + iVar9) - 1),0);
          ppcVar5 = __gnu_cxx::
                    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                    ::operator*(&local_e8);
          cmCursesWidget::SetPage((*ppcVar5)->Entry,this->NumberOfPages);
          it_1._M_current._0_4_ = (int)it_1._M_current + 1;
        }
        __gnu_cxx::
        __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
        ::operator++(&local_e8);
      }
    }
    pFVar7 = new_form(this->Fields);
    (this->super_cmCursesForm).Form = pFVar7;
    post_form((this->super_cmCursesForm).Form);
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
    PrintKeys(this,0);
    if (_stdscr == 0) {
      local_224 = -1;
    }
    else {
      local_224 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,local_224,1);
    refresh();
  }
  return;
}

Assistant:

void cmCursesMainForm::Render(int left, int top, int width, int height)
{

  if (this->Form)
    {
    FIELD* currentField = current_field(this->Form);
    cmCursesWidget* cw = reinterpret_cast<cmCursesWidget*>
      (field_userptr(currentField));
    // If in edit mode, get out of it
    if ( cw->GetType() == cmState::STRING ||
         cw->GetType() == cmState::PATH   ||
         cw->GetType() == cmState::FILEPATH )
      {
      cmCursesStringWidget* sw = static_cast<cmCursesStringWidget*>(cw);
      sw->SetInEdit(false);
      }
    // Delete the previous form
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = 0;
    }

  // Wrong window size
  if ( width < cmCursesMainForm::MIN_WIDTH  ||
       width < this->InitialWidth               ||
       height < cmCursesMainForm::MIN_HEIGHT )
    {
    return;
    }

  // Leave room for toolbar
  height -= 7;

  if (this->AdvancedMode)
    {
    this->NumberOfVisibleEntries = this->Entries->size();
    }
  else
    {
    // If normal, display only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
      {
      const char* existingValue =
          this->CMakeInstance->GetState()
              ->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
          this->CMakeInstance->GetState()
              ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced))
        {
        continue;
        }
      this->NumberOfVisibleEntries++;
      }
    }

  // Re-adjust the fields according to their place
  this->NumberOfPages = 1;
  if (height > 0)
    {
    bool isNewPage;
    int i=0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
      {
      const char* existingValue =
          this->CMakeInstance->GetState()
              ->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
          this->CMakeInstance->GetState()
              ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced))
        {
        continue;
        }
      int row = (i % height) + 1;
      int page = (i / height) + 1;
      isNewPage = ( page > 1 ) && ( row == 1 );

      if (isNewPage)
        {
        this->NumberOfPages++;
        }
      (*it)->Label->Move(left, top+row-1, isNewPage);
      (*it)->IsNewLabel->Move(left+32, top+row-1, false);
      (*it)->Entry->Move(left+33, top+row-1, false);
      (*it)->Entry->SetPage(this->NumberOfPages);
      i++;
      }
    }

  // Post the form
  this->Form = new_form(this->Fields);
  post_form(this->Form);
  // Update toolbar
  this->UpdateStatusBar();
  this->PrintKeys();

  touchwin(stdscr);
  refresh();
}